

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::CalculateNumYLevels(EXRHeader *exr_header)

{
  long in_RDI;
  int h_1;
  int h;
  int w;
  int num;
  int max_y;
  int min_y;
  int max_x;
  int min_x;
  int in_stack_ffffffffffffffd0;
  int x;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_c = *(int *)(in_RDI + 8);
  local_10 = *(int *)(in_RDI + 0x10);
  local_14 = *(int *)(in_RDI + 0xc);
  local_18 = *(int *)(in_RDI + 0x14);
  local_1c = 0;
  x = *(int *)(in_RDI + 0x44);
  if (x == 0) {
    local_1c = 1;
  }
  else if (x == 1) {
    local_20 = (local_10 - local_c) + 1;
    local_24 = (local_18 - local_14) + 1;
    std::max<int>(&local_20,&local_24);
    local_1c = RoundLog2(x,in_stack_ffffffffffffffd0);
    local_1c = local_1c + 1;
  }
  else if (x == 2) {
    local_1c = RoundLog2(2,in_stack_ffffffffffffffd0);
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

static int CalculateNumYLevels(const EXRHeader* exr_header) {
  int min_x = exr_header->data_window.min_x;
  int max_x = exr_header->data_window.max_x;
  int min_y = exr_header->data_window.min_y;
  int max_y = exr_header->data_window.max_y;
  int num = 0;

  switch (exr_header->tile_level_mode) {
  case TINYEXR_TILE_ONE_LEVEL:

    num = 1;
    break;

  case TINYEXR_TILE_MIPMAP_LEVELS:

  {
    int w = max_x - min_x + 1;
    int h = max_y - min_y + 1;
    num = RoundLog2(std::max(w, h), exr_header->tile_rounding_mode) + 1;
  }
  break;

  case TINYEXR_TILE_RIPMAP_LEVELS:

  {
    int h = max_y - min_y + 1;
    num = RoundLog2(h, exr_header->tile_rounding_mode) + 1;
  }
  break;

  default:

    assert(false);
  }

  return num;
}